

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

internal_node<char,_false> *
immutable::rrb_details::internal_node_merge<char,false>
          (ref<immutable::rrb_details::internal_node<char,_false>_> *left,
          ref<immutable::rrb_details::internal_node<char,_false>_> *centre,
          ref<immutable::rrb_details::internal_node<char,_false>_> *right)

{
  internal_node<char,_false> *piVar1;
  internal_node<char,_false> *piVar2;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  internal_node<char,_false> *merged;
  uint32_t right_len;
  uint32_t centre_len;
  uint32_t left_len;
  ref<immutable::rrb_details::internal_node<char,_false>_> *right_local;
  ref<immutable::rrb_details::internal_node<char,_false>_> *centre_local;
  ref<immutable::rrb_details::internal_node<char,_false>_> *left_local;
  
  if (left->ptr == (internal_node<char,_false> *)0x0) {
    local_48 = 0;
  }
  else {
    piVar1 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(left);
    local_48 = piVar1->len - 1;
  }
  if (centre->ptr == (internal_node<char,_false> *)0x0) {
    local_4c = 0;
  }
  else {
    piVar1 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(centre);
    local_4c = piVar1->len;
  }
  if (right->ptr == (internal_node<char,_false> *)0x0) {
    local_50 = 0;
  }
  else {
    piVar1 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(right);
    local_50 = piVar1->len - 1;
  }
  piVar1 = internal_node_create<char,false>(local_48 + local_4c + local_50);
  for (i_2 = 0; i_2 < local_48; i_2 = i_2 + 1) {
    piVar2 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(left);
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              (piVar1->child + i_2,piVar2->child + i_2);
  }
  for (local_40 = 0; local_40 < local_4c; local_40 = local_40 + 1) {
    piVar2 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(centre);
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              (piVar1->child + (local_48 + local_40),piVar2->child + local_40);
  }
  for (local_44 = 0; local_44 < local_50; local_44 = local_44 + 1) {
    piVar2 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(right);
    ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
              (piVar1->child + (local_48 + local_4c + local_44),piVar2->child + (local_44 + 1));
  }
  return piVar1;
}

Assistant:

inline internal_node<T, atomic_ref_counting>* internal_node_merge(const ref<internal_node<T, atomic_ref_counting>>& left, const ref<internal_node<T, atomic_ref_counting>>& centre, const ref<internal_node<T, atomic_ref_counting>>& right)
      {
      // If internal node is NULL, its size is zero.
      uint32_t left_len = (left.ptr == nullptr) ? 0 : left->len - 1;
      uint32_t centre_len = (centre.ptr == nullptr) ? 0 : centre->len;
      uint32_t right_len = (right.ptr == nullptr) ? 0 : right->len - 1;

      internal_node<T, atomic_ref_counting>* merged = internal_node_create<T, atomic_ref_counting>(left_len + centre_len + right_len);
      for (uint32_t i = 0; i < left_len; ++i)
        merged->child[i] = left->child[i];
      for (uint32_t i = 0; i < centre_len; ++i)
        merged->child[left_len + i] = centre->child[i];
      for (uint32_t i = 0; i < right_len; ++i)
        merged->child[left_len + centre_len + i] = right->child[i + 1];

      return merged;
      }